

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  undefined1 auVar1 [16];
  char cVar2;
  ostream *poVar3;
  size_t sVar4;
  int *__pipedes;
  ulong uVar5;
  undefined1 auVar6 [16];
  pipe<char> p;
  MyQueue qu;
  pipe<char> cq;
  pipe<int> iq;
  pipe<char> local_80;
  span<int> local_78 [2];
  pipe<char> local_50;
  pipe<int> local_48;
  undefined8 local_40;
  long local_38;
  
  mtrace();
  local_80._d._ref = (reference<mpt::pipe<char>::instance>)(instance *)0x0;
  mpt::pipe<char>::ref(&local_80);
  if (local_80._d._ref != (instance *)0x0) {
    local_78[0]._base = (int *)CONCAT71(local_78[0]._base._1_7_,0x61);
    (**(code **)(*(long *)local_80._d._ref + 0x48))(local_80._d._ref,local_78,1);
  }
  if (local_80._d._ref != (instance *)0x0) {
    local_78[0]._base = (int *)CONCAT71(local_78[0]._base._1_7_,0x6c);
    (**(code **)(*(long *)local_80._d._ref + 0x48))(local_80._d._ref,local_78,1);
  }
  if (local_80._d._ref != (instance *)0x0) {
    local_78[0]._base = (int *)CONCAT71(local_78[0]._base._1_7_,0x6c);
    (**(code **)(*(long *)local_80._d._ref + 0x48))(local_80._d._ref,local_78,1);
  }
  if (local_80._d._ref != (instance *)0x0) {
    local_78[0]._base = (int *)CONCAT71(local_78[0]._base._1_7_,0x6f);
    (**(code **)(*(long *)local_80._d._ref + 0x48))(local_80._d._ref,local_78,1);
  }
  if (local_80._d._ref != (instance *)0x0) {
    local_78[0]._base = (int *)CONCAT71(local_78[0]._base._1_7_,0x68);
    (**(code **)(*(long *)local_80._d._ref + 0x58))(local_80._d._ref,local_78,1);
  }
  if (local_80._d._ref == (instance *)0x0) {
    local_78[0] = (span<int>)ZEXT816(0);
  }
  else {
    local_78[0] = (span<int>)(**(code **)(*(long *)local_80._d._ref + 0x20))(local_80._d._ref,0);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_78[0]._len;
    if ((long)local_78[0]._len < 0) {
      local_78[0] = (span<int>)(auVar6 << 0x40);
    }
  }
  poVar3 = operator<<((ostream *)&std::cout,(span *)local_78);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  local_78[0]._base = (int *)CONCAT44(local_78[0]._base._4_4_,5);
  mpt::pipe<int>::pipe(&local_48,(int *)local_78);
  if (local_48._d._ref == (instance *)0x0) {
    local_78[0]._base = (int *)0x0;
    local_78[0]._len = 0;
  }
  else {
    auVar6 = (**(code **)(*(long *)local_48._d._ref + 0x20))(local_48._d._ref,0);
    local_78[0]._base = auVar6._0_8_;
    local_78[0]._len = auVar6._8_8_ & 0xfffffffffffffffc;
  }
  poVar3 = operator<<((ostream *)&std::cout,local_78);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  local_78[0]._base._0_1_ = 0x61;
  mpt::pipe<char>::pipe(&local_50,(int *)local_78);
  if (local_50._d._ref != (instance *)0x0) {
    local_78[0]._base._0_1_ = 0x62;
    (**(code **)(*(long *)local_50._d._ref + 0x48))(local_50._d._ref,local_78,1);
  }
  if (local_50._d._ref == (instance *)0x0) {
    local_78[0] = (span<int>)ZEXT816(0);
  }
  else {
    local_78[0] = (span<int>)(**(code **)(*(long *)local_50._d._ref + 0x20))(local_50._d._ref,0);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_78[0]._len;
    if ((long)local_78[0]._len < 0) {
      local_78[0] = (span<int>)(auVar1 << 0x40);
    }
  }
  poVar3 = operator<<((ostream *)&std::cout,(span *)local_78);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  mpt::io::queue::queue((queue *)local_78,0);
  local_78[0]._base = (int *)&PTR_write_00104b38;
  mpt::io::queue::prepare((ulong)local_78);
  (**(code **)((long)local_78[0]._base + 0x48))(local_78,"hallo",5);
  local_40 = CONCAT71(local_40._1_7_,0x7b);
  (**(code **)((long)local_78[0]._base + 0x48))(local_78,&local_40,1);
  if (1 < argc) {
    uVar5 = 1;
    do {
      __s = argv[uVar5];
      sVar4 = strlen(__s);
      (**(code **)((long)local_78[0]._base + 0x48))(local_78,__s,sVar4);
      uVar5 = uVar5 + 1;
    } while ((uint)argc != uVar5);
  }
  local_40._0_1_ = (span)0x7d;
  (**(code **)((long)local_78[0]._base + 0x48))(local_78,&local_40,1);
  (**(code **)((long)local_78[0]._base + 0x48))(local_78,"hallo",5);
  local_40 = CONCAT71(local_40._1_7_,0x74);
  (**(code **)((long)local_78[0]._base + 0x48))(local_78,&local_40,1);
  mpt::io::queue::shift(local_78,0);
  mpt::io::queue::shift(local_78,0);
  auVar6 = (**(code **)((long)local_78[0]._base + 0x20))(local_78,0);
  local_38 = auVar6._8_8_;
  local_40 = auVar6._0_8_;
  if (local_38 < 0) {
    local_40 = 0;
  }
  poVar3 = operator<<((ostream *)&std::cout,(span *)&local_40);
  cVar2 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  __pipedes = (int *)(ulong)(uint)(int)cVar2;
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  mpt::io::queue::~queue((queue *)local_78);
  mpt::pipe<char>::~pipe(&local_50,__pipedes);
  mpt::pipe<int>::~pipe(&local_48,__pipedes);
  mpt::pipe<char>::~pipe(&local_80,__pipedes);
  return 0;
}

Assistant:

extern int main(int argc, char * const argv[])
{
	mtrace();
	
	mpt::pipe<char> p;
	p.push('a');
	p.push('l');
	p.push('l');
	p.push('o');
	p.unshift('h');
	std::cout << p.elements() << std::endl;
	
	
	mpt::pipe<int> iq(5, 8);
	std::cout << iq.elements() << std::endl;
	
	mpt::pipe<char> cq('a', 4);
	cq.push('b');
	std::cout << cq.elements() << std::endl;
	
	
	MyQueue qu;
	qu.prepare(456);
	mpt::io::queue *raw = &qu;
	
	raw->push("hallo", 5);
	
	qu.add('{');
	for (int i = 1; i < argc; ++i) {
		qu.add(argv[i]);
	}
	qu.add('}');
	qu.add("hallo");
	qu.add('t');
	qu.shift(0, 1);
	qu.shift(0, 1);
	
	std::cout << qu.string() << std::endl;
	
	return 0;
}